

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_good_speed_features_lc_dec_framesize_independent(AV1_COMP *cpi,SPEED_FEATURES *sf)

{
  FRAME_UPDATE_TYPE FVar1;
  long in_RSI;
  long *in_RDI;
  FRAME_UPDATE_TYPE update_type;
  
  FVar1 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
  if ((int)in_RDI[0x84e6] != 0) {
    *(uint *)(in_RSI + 0x39c) = (uint)(FVar1 != '\x04' && FVar1 != '\x05');
  }
  return;
}

Assistant:

static void set_good_speed_features_lc_dec_framesize_independent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf) {
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);

  if (cpi->oxcf.enable_low_complexity_decode >= 1) {
    sf->lpf_sf.adaptive_luma_loop_filter_skip =
        (update_type != OVERLAY_UPDATE && update_type != INTNL_OVERLAY_UPDATE)
            ? 1
            : 0;
  }
}